

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::blockScalarString(Output *this,StringRef *S)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  StringRef s;
  StringRef s_00;
  StringRef BufferName;
  StringRef InputData;
  undefined1 local_58 [8];
  line_iterator Lines;
  
  if ((this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
      super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
      super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size
      != 0) {
    newLineCheck(this);
  }
  s.Length = 2;
  s.Data = " |";
  output(this,s);
  outputNewLine(this);
  uVar1 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
          super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
          super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.
          Size;
  BufferName.Length = (size_t)"";
  BufferName.Data = (char *)S->Length;
  InputData.Length = (size_t)S->Data;
  InputData.Data = (char *)&Lines.CurrentLine.Length;
  MemoryBuffer::getMemBuffer(InputData,BufferName,false);
  line_iterator::line_iterator
            ((line_iterator *)local_58,(MemoryBuffer *)Lines.CurrentLine.Length,false,'\0');
  while (iVar2 = uVar1 + (uVar1 == 0), local_58 != (undefined1  [8])0x0) {
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      s_00.Length = 2;
      s_00.Data = "  ";
      output(this,s_00);
    }
    output(this,(StringRef)Lines._8_16_);
    outputNewLine(this);
    line_iterator::advance((line_iterator *)local_58);
  }
  if (Lines.CurrentLine.Length != 0) {
    (**(code **)(*(long *)Lines.CurrentLine.Length + 8))();
  }
  return;
}

Assistant:

void Output::blockScalarString(StringRef &S) {
  if (!StateStack.empty())
    newLineCheck();
  output(" |");
  outputNewLine();

  unsigned Indent = StateStack.empty() ? 1 : StateStack.size();

  auto Buffer = MemoryBuffer::getMemBuffer(S, "", false);
  for (line_iterator Lines(*Buffer, false); !Lines.is_at_end(); ++Lines) {
    for (unsigned I = 0; I < Indent; ++I) {
      output("  ");
    }
    output(*Lines);
    outputNewLine();
  }
}